

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.cpp
# Opt level: O0

void __thiscall mir::inst::AssignInst::display(AssignInst *this,ostream *o)

{
  ostream *poVar1;
  ostream *in_RSI;
  Displayable *in_RDI;
  
  poVar1 = prelude::operator<<(in_RSI,in_RDI);
  std::operator<<(poVar1," = ");
  prelude::operator<<(in_RSI,in_RDI);
  return;
}

Assistant:

void AssignInst::display(std::ostream& o) const { o << dest << " = " << src; }